

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bool slang::literalBaseFromChar(char base,LiteralBase *result)

{
  LiteralBase *result_local;
  char base_local;
  bool local_1;
  
  switch(base) {
  case 'B':
  case 'b':
    *result = Binary;
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case 'D':
  case 'd':
    *result = Decimal;
    local_1 = true;
    break;
  case 'H':
  case 'h':
    *result = Hex;
    local_1 = true;
    break;
  case 'O':
  case 'o':
    *result = Octal;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool literalBaseFromChar(char base, LiteralBase& result) {
    switch (base) {
        case 'd':
        case 'D':
            result = LiteralBase::Decimal;
            return true;
        case 'b':
        case 'B':
            result = LiteralBase::Binary;
            return true;
        case 'o':
        case 'O':
            result = LiteralBase::Octal;
            return true;
        case 'h':
        case 'H':
            result = LiteralBase::Hex;
            return true;
        default:
            return false;
    }
}